

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * getTypedProperty<char_const*>
                 (cmGeneratorTarget *tgt,string *prop,
                 cmGeneratorExpressionInterpreter *genexInterpreter)

{
  cmValue cVar1;
  string *psVar2;
  pointer pcVar3;
  allocator<char> local_39;
  string local_38;
  
  cVar1 = cmGeneratorTarget::GetProperty(tgt,prop);
  if (genexInterpreter == (cmGeneratorExpressionInterpreter *)0x0) {
    if (cVar1.Value == (string *)0x0) {
      pcVar3 = (pointer)0x0;
    }
    else {
      pcVar3 = ((cVar1.Value)->_M_dataplus)._M_p;
    }
  }
  else {
    if (cVar1.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    }
    else {
      std::__cxx11::string::string((string *)&local_38,(string *)cVar1.Value);
    }
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate(genexInterpreter,&local_38,prop);
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return pcVar3;
}

Assistant:

const char* getTypedProperty<const char*>(
  cmGeneratorTarget const* tgt, const std::string& prop,
  cmGeneratorExpressionInterpreter* genexInterpreter)
{
  cmValue value = tgt->GetProperty(prop);

  if (genexInterpreter == nullptr) {
    return value.GetCStr();
  }

  return genexInterpreter->Evaluate(value ? *value : "", prop).c_str();
}